

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_handle_line(Parser *this)

{
  uint uVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  bool bVar5;
  State *pSVar6;
  csubstr cVar7;
  char *pcStack_58;
  size_t local_50;
  char msg [53];
  
  pSVar6 = this->m_state;
  if (((pSVar6->line_contents).rem.len == 0) || ((pSVar6->line_contents).rem.str == (char *)0x0)) {
    builtin_strncpy(msg,"check failed: (! m_state->line_contents.rem.empty())",0x35);
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar7.len;
    pcStack_58 = cVar7.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6bfd) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x6bfd) << 0x40,8);
    LVar4.name.str = pcStack_58;
    LVar4.name.len = local_50;
    (*p_Var2)(msg,0x35,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar6 = this->m_state;
  }
  uVar1 = pSVar6->flags;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 2) == 0) goto LAB_001bee58;
      bVar5 = _handle_unk(this);
    }
    else if ((uVar1 & 0x10) == 0) {
      bVar5 = _handle_map_blck(this);
    }
    else {
      bVar5 = _handle_map_flow(this);
    }
  }
  else {
    if ((uVar1 & 0x10) != 0) {
      _handle_seq_flow(this);
      return;
    }
    bVar5 = _handle_seq_blck(this);
  }
  if (bVar5 != false) {
    return;
  }
LAB_001bee58:
  _handle_top(this);
  return;
}

Assistant:

void Parser::_handle_line()
{
    _c4dbgq("\n-----------");
    _c4dbgt("handling line={}, offset={}B", m_state->pos.line, m_state->pos.offset);
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! m_state->line_contents.rem.empty());
    if(has_any(RSEQ))
    {
        if(has_any(FLOW))
        {
            if(_handle_seq_flow())
                return;
        }
        else
        {
            if(_handle_seq_blck())
                return;
        }
    }
    else if(has_any(RMAP))
    {
        if(has_any(FLOW))
        {
            if(_handle_map_flow())
                return;
        }
        else
        {
            if(_handle_map_blck())
                return;
        }
    }
    else if(has_any(RUNK))
    {
        if(_handle_unk())
            return;
    }

    if(_handle_top())
        return;
}